

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

char * oonf_layer2_neigh_key_to_string
                 (oonf_layer2_neigh_key_str *buf,oonf_layer2_neigh_key *key,_Bool show_mac)

{
  char *pcVar1;
  size_t sVar2;
  byte bVar3;
  
  pcVar1 = "-";
  if ((key != (oonf_layer2_neigh_key *)0x0) && (0xfd < (byte)((key->addr)._type - 0x31))) {
    if (show_mac) {
      netaddr_to_prefixstring(&buf->nbuf,&key->addr,false);
    }
    else {
      (buf->nbuf).buf[0] = '\0';
    }
    bVar3 = key->link_id_length;
    pcVar1 = (char *)buf;
    if (bVar3 != 0) {
      sVar2 = strlen(buf->buf);
      if (show_mac) {
        buf->buf[sVar2] = ',';
        sVar2 = sVar2 + 1;
        bVar3 = key->link_id_length;
      }
      strhex_from_bin(buf->buf + sVar2,99 - sVar2,key->link_id,(ulong)bVar3);
    }
  }
  return pcVar1;
}

Assistant:

const char *
oonf_layer2_neigh_key_to_string(union oonf_layer2_neigh_key_str *buf,
    const struct oonf_layer2_neigh_key *key, bool show_mac) {
  static const char NONE[] = "-";
  size_t str_idx;
  uint8_t af;

  if (key == NULL) {
    return NONE;
  }

  af = netaddr_get_address_family(&key->addr);
  if (af != AF_MAC48 && af != AF_EUI64) {
    return NONE;
  }

  if (show_mac) {
    netaddr_to_string(&buf->nbuf, &key->addr);
  }
  else {
    buf->buf[0] = 0;
  }

  if (key->link_id_length == 0) {
    return buf->buf;
  }

  str_idx = strlen(buf->buf);

  if (show_mac) {
    buf->buf[str_idx++] = ',';
  }

  strhex_from_bin(&buf->buf[str_idx], sizeof(*buf) - str_idx, key->link_id, key->link_id_length);
  return buf->buf;
}